

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O0

void __thiscall JSON::Reactor::Reactor(Reactor *this)

{
  Reactor *this_local;
  
  this->_vptr_Reactor = (_func_int **)&PTR__Reactor_0058f9d0;
  return;
}

Assistant:

class QPDF_DLL_CLASS Reactor
    {
      public:
        virtual ~Reactor() = default;

        // The start/end methods are called when parsing of a dictionary or array is started or
        // ended. The item methods are called when an item is added to a dictionary or array. When
        // adding a container to another container, the item method is called with an empty
        // container before the lower container's start method is called. See important notes in
        // "Item methods" below.

        // During parsing of a JSON string, the parser is operating on a single object at a time.
        // When a dictionary or array is started, a new context begins, and when that dictionary or
        // array is ended, the previous context is resumed. So, for
        // example, if you have `{"a": [1]}`, you will receive the
        // following method calls
        //
        // dictionaryStart -- current object is the top-level dictionary
        // dictionaryItem  -- called with "a" and an empty array
        // arrayStart      -- current object is the array
        // arrayItem       -- called with the "1" object
        // containerEnd    -- now current object is the dictionary again
        // containerEnd    -- current object is undefined
        //
        // If the top-level item in a JSON string is a scalar, the topLevelScalar() method will be
        // called. No argument is passed since the object is the same as what is returned by
        // parse().

        QPDF_DLL
        virtual void dictionaryStart() = 0;
        QPDF_DLL
        virtual void arrayStart() = 0;
        QPDF_DLL
        virtual void containerEnd(JSON const& value) = 0;
        QPDF_DLL
        virtual void topLevelScalar() = 0;

        // Item methods:
        //
        // The return value of the item methods indicate whether the item has been "consumed". If
        // the item method returns true, then the item will not be added to the containing JSON
        // object. This is what allows arbitrarily large JSON objects
        // to be parsed and not have to be kept in memory.
        //
        // NOTE: When a dictionary or an array is added to a container, the dictionaryItem or
        // arrayItem method is called when the child item's start delimiter is encountered, so the
        // JSON object passed in at that time will always be in its initial, empty state.
        // Additionally, the child item's start method is not called until after the parent item's
        // item method is called. This makes it possible to keep track of the current depth level by
        // incrementing level on start methods and decrementing on end methods.

        QPDF_DLL
        virtual bool dictionaryItem(std::string const& key, JSON const& value) = 0;
        QPDF_DLL
        virtual bool arrayItem(JSON const& value) = 0;
    }